

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::samplers::Sampler_testAdaptiveSamplerUpdate_Test::
Sampler_testAdaptiveSamplerUpdate_Test(Sampler_testAdaptiveSamplerUpdate_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00221ba8;
  return;
}

Assistant:

TEST(Sampler, testAdaptiveSamplerUpdate)
{
    namespace thriftgen = sampling_manager::thrift;

    constexpr auto kSamplingRate = 0.1;
    constexpr auto kLowerBound = 2.0;

    thriftgen::OperationSamplingStrategy strategy;
    strategy.__set_operation(kTestOperationName);
    thriftgen::ProbabilisticSamplingStrategy probabilisticSampling;
    probabilisticSampling.__set_samplingRate(kSamplingRate);
    strategy.__set_probabilisticSampling(probabilisticSampling);

    thriftgen::PerOperationSamplingStrategies strategies;
    strategies.__set_defaultSamplingProbability(
        kTestDefaultSamplingProbability);
    strategies.__set_defaultLowerBoundTracesPerSecond(kLowerBound);
    strategies.__set_perOperationStrategies({ strategy });

    AdaptiveSampler sampler(strategies, kTestDefaultMaxOperations);

    constexpr auto kNewSamplingRate = 0.2;
    constexpr auto kNewLowerBound = 3.0;
    constexpr auto kNewDefaultSamplingProbability = 0.1;

    // Updated kTestOperationName strategy.
    thriftgen::OperationSamplingStrategy updatedStrategy;
    updatedStrategy.__set_operation(kTestOperationName);
    thriftgen::ProbabilisticSamplingStrategy updatedProbabilisticSampling;
    updatedProbabilisticSampling.__set_samplingRate(kNewSamplingRate);
    updatedStrategy.__set_probabilisticSampling(updatedProbabilisticSampling);

    // New kTestFirstTimeOperationName strategy.
    thriftgen::OperationSamplingStrategy newStrategy;
    newStrategy.__set_operation(kTestFirstTimeOperationName);
    thriftgen::ProbabilisticSamplingStrategy newProbabilisticSampling;
    newProbabilisticSampling.__set_samplingRate(kNewSamplingRate);
    newStrategy.__set_probabilisticSampling(newProbabilisticSampling);

    thriftgen::PerOperationSamplingStrategies newStrategies;
    newStrategies.__set_defaultSamplingProbability(
        kNewDefaultSamplingProbability);
    newStrategies.__set_defaultLowerBoundTracesPerSecond(kNewLowerBound);
    newStrategies.__set_perOperationStrategies(
        { updatedStrategy, newStrategy });

    sampler.update(newStrategies);
}